

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImDrawDataBuilder::FlattenIntoSingleLayer(ImDrawDataBuilder *this)

{
  _Bool _Var1;
  ImVector<ImDrawList_*> *this_00;
  ImDrawList **__dest;
  ImDrawList **__src;
  ImVector_ImDrawListPtr *layer;
  int layer_n;
  int i;
  int size;
  int n;
  ImDrawDataBuilder *this_local;
  
  i = this->Layers[0].Size;
  layer_n = i;
  for (layer._4_4_ = 1; layer._4_4_ < 2; layer._4_4_ = layer._4_4_ + 1) {
    layer_n = this->Layers[layer._4_4_].Size + layer_n;
  }
  ImVector<ImDrawList_*>::resize((ImVector<ImDrawList_*> *)this,layer_n);
  for (layer._0_4_ = 1; (int)layer < 2; layer._0_4_ = (int)layer + 1) {
    this_00 = (ImVector<ImDrawList_*> *)(this->Layers + (int)layer);
    _Var1 = ImVector<ImDrawList_*>::empty(this_00);
    if (!_Var1) {
      __dest = ImVector<ImDrawList_*>::operator[]((ImVector<ImDrawList_*> *)this,i);
      __src = ImVector<ImDrawList_*>::operator[](this_00,0);
      memcpy(__dest,__src,(long)*(int *)this_00 << 3);
      i = *(int *)this_00 + i;
      ImVector<ImDrawList_*>::resize(this_00,0);
    }
  }
  return;
}

Assistant:

void ImDrawDataBuilder::FlattenIntoSingleLayer()
{
    int n = Layers[0].Size;
    int size = n;
    for (int i = 1; i < IM_ARRAYSIZE(Layers); i++)
        size += Layers[i].Size;
    Layers[0].resize(size);
    for (int layer_n = 1; layer_n < IM_ARRAYSIZE(Layers); layer_n++)
    {
        ImVector<ImDrawList*>& layer = Layers[layer_n];
        if (layer.empty())
            continue;
        memcpy(&Layers[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
        n += layer.Size;
        layer.resize(0);
    }
}